

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O0

void __thiscall vigra::BmpDecoderImpl::read_rgb_data(BmpDecoderImpl *this)

{
  int iVar1;
  value_type vVar2;
  uint uVar3;
  _Ios_Seekdir _Var4;
  long in_RDI;
  int x;
  int y;
  UInt8 *mover;
  UInt8 *base;
  uint pad_size;
  uint image_size;
  uint line_size;
  size_type in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_30;
  int local_2c;
  value_type *local_28;
  value_type *local_20;
  
  uVar3 = *(int *)(in_RDI + 0x218) * 3;
  iVar1 = *(int *)(in_RDI + 0x21c);
  std::istream::seekg(in_RDI,*(_Ios_Seekdir *)(in_RDI + 0x210));
  void_vector<unsigned_char>::resize
            ((void_vector<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
            );
  if ((uVar3 & 3) == 0) {
    _Var4 = _S_beg;
  }
  else {
    _Var4 = 4 - (uVar3 & 3);
  }
  local_20 = void_vector<unsigned_char>::data((void_vector<unsigned_char> *)0x14fea4);
  local_20 = local_20 + iVar1 * uVar3;
  local_2c = *(int *)(in_RDI + 0x21c);
  while (local_2c = local_2c + -1, -1 < local_2c) {
    local_20 = local_20 + -(ulong)uVar3;
    local_28 = local_20;
    for (local_30 = 0; local_30 < *(int *)(in_RDI + 0x218); local_30 = local_30 + 1) {
      vVar2 = std::istream::get();
      local_28[2] = vVar2;
      vVar2 = std::istream::get();
      local_28[1] = vVar2;
      vVar2 = std::istream::get();
      *local_28 = vVar2;
      local_28 = local_28 + 3;
    }
    std::istream::seekg(in_RDI,_Var4);
  }
  return;
}

Assistant:

void BmpDecoderImpl::read_rgb_data ()
{
    const unsigned int line_size = 3 * info_header.width;
    const unsigned int image_size = info_header.height * line_size;

    // seek to the data
    stream.seekg( file_header.offset, std::ios::beg );

    // make room for the pixels
    pixels.resize(image_size);

    // padding after each scanline.
    // citing Kevin D. Quitt's mail to wotsit.org:
    // In RGB encoding (no compression), when using 8 bits per pixel, lines
    // must start on a long-word boundary (i.e., low two bits zero).
    const unsigned int pad_size = (line_size % 4) ? 4 - (line_size % 4) : 0;

    // setup the base pointer at one line after the end
    UInt8 * base = pixels.data() + image_size;
    UInt8 * mover;

    // read scanlines from bottom to top
    for ( int y = info_header.height - 1; y >= 0; --y ) {

        // set the base pointer to the beginning of the line to be read
        base -= line_size;
        mover = base;

        // read the line from left to right
        for ( int x = 0; x < info_header.width; ++x ) {
            mover[2] = stream.get(); // B
            mover[1] = stream.get(); // G
            mover[0] = stream.get(); // R
            mover += 3;
        }

        // advance to the next 32 bit boundary
        stream.seekg( pad_size, std::ios::cur );
    }
}